

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
 wabt::MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>,_true,_true>
  in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x118);
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)(puVar1 + 7) = 7;
  *puVar1 = &PTR__BlockExprBase_0155b710;
  Block::Block((Block *)(puVar1 + 8));
  *(undefined8 **)
   in_RDI.
   super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
   .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>,_true,_true>
          )(tuple<wabt::BlockExprBase<(wabt::ExprType)7>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
             .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)7>_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}